

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O2

GCfunc * lj_func_newL_empty(lua_State *L,GCproto *pt,GCtab *env)

{
  byte bVar1;
  ushort uVar2;
  GCfunc *pGVar3;
  void *pvVar4;
  ulong uVar5;
  
  pGVar3 = func_newL(L,pt,env);
  bVar1 = pt->sizeuv;
  for (uVar5 = 0; bVar1 != uVar5; uVar5 = uVar5 + 1) {
    pvVar4 = lj_mem_newgco(L,0x30);
    *(undefined2 *)((long)pvVar4 + 9) = 0x105;
    *(undefined8 *)((long)pvVar4 + 0x10) = 0xffffffffffffffff;
    *(long *)((long)pvVar4 + 0x20) = (long)pvVar4 + 0x10;
    uVar2 = *(ushort *)((pt->uv).ptr64 + uVar5 * 2);
    *(byte *)((long)pvVar4 + 0xb) = (byte)(uVar2 >> 0xe) & 1;
    *(uint *)((long)pvVar4 + 0x28) = (uint)uVar2 << 0x18 ^ (uint)pt;
    *(void **)((long)pGVar3 + uVar5 * 8 + 0x28) = pvVar4;
  }
  (pGVar3->c).nupvalues = bVar1;
  return pGVar3;
}

Assistant:

GCfunc *lj_func_newL_empty(lua_State *L, GCproto *pt, GCtab *env)
{
  GCfunc *fn = func_newL(L, pt, env);
  MSize i, nuv = pt->sizeuv;
  /* NOBARRIER: The GCfunc is new (marked white). */
  for (i = 0; i < nuv; i++) {
    GCupval *uv = func_emptyuv(L);
    int32_t v = proto_uv(pt)[i];
    uv->immutable = ((v / PROTO_UV_IMMUTABLE) & 1);
    uv->dhash = (uint32_t)(uintptr_t)pt ^ (v << 24);
    setgcref(fn->l.uvptr[i], obj2gco(uv));
  }
  fn->l.nupvalues = (uint8_t)nuv;
  return fn;
}